

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMesh.cpp
# Opt level: O2

int __thiscall
cbtTriangleMesh::findOrAddVertex
          (cbtTriangleMesh *this,cbtVector3 *vertex,bool removeDuplicateVertices)

{
  int *piVar1;
  cbtAlignedObjectArray<float> *this_00;
  float *pfVar2;
  cbtIndexedMesh *pcVar3;
  int iVar4;
  int i_1;
  long lVar5;
  int i;
  ulong uVar6;
  cbtScalar cVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar8 [64];
  undefined1 extraout_var [60];
  undefined1 auVar9 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  cbtVector3 cVar14;
  cbtVector3 vtx;
  cbtVector3 local_40;
  
  if (this->m_use4componentVertices == true) {
    if (removeDuplicateVertices) {
      lVar5 = 0;
      uVar6 = 0;
      while( true ) {
        auVar13 = in_ZMM1._8_56_;
        auVar10 = in_ZMM0._8_56_;
        if ((long)(this->m_4componentVertices).m_size <= (long)uVar6) break;
        cVar14 = ::operator-((cbtVector3 *)
                             ((long)((this->m_4componentVertices).m_data)->m_floats + lVar5),vertex)
        ;
        auVar11._0_8_ = cVar14.m_floats._8_8_;
        auVar11._8_56_ = auVar13;
        auVar8._0_8_ = cVar14.m_floats._0_8_;
        auVar8._8_56_ = auVar10;
        vtx.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar8._0_16_,auVar11._0_16_);
        in_ZMM0._0_4_ = cbtVector3::length2(&vtx);
        in_ZMM0._4_60_ = extraout_var;
        in_ZMM1 = ZEXT464((uint)this->m_weldingThreshold);
        if (in_ZMM0._0_4_ <= this->m_weldingThreshold) goto LAB_00dfa04f;
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x10;
      }
    }
    piVar1 = &((this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_numVertices;
    *piVar1 = *piVar1 + 1;
    cbtAlignedObjectArray<cbtVector3>::push_back(&this->m_4componentVertices,vertex);
    ((this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_vertexBase =
         (uchar *)(this->m_4componentVertices).m_data;
    iVar4 = (this->m_4componentVertices).m_size;
  }
  else {
    if (removeDuplicateVertices) {
      uVar6 = 0;
      for (lVar5 = 0; auVar10 = in_ZMM1._8_56_, lVar5 < (this->m_3componentVertices).m_size;
          lVar5 = lVar5 + 3) {
        pfVar2 = (this->m_3componentVertices).m_data;
        vtx.m_floats[1] = pfVar2[lVar5 + 1];
        vtx.m_floats[0] = pfVar2[lVar5];
        auVar13 = (undefined1  [56])0x0;
        vtx.m_floats[2] = pfVar2[lVar5 + 2];
        vtx.m_floats[3] = 0.0;
        cVar14 = ::operator-(&vtx,vertex);
        auVar12._0_8_ = cVar14.m_floats._8_8_;
        auVar12._8_56_ = auVar10;
        auVar9._0_8_ = cVar14.m_floats._0_8_;
        auVar9._8_56_ = auVar13;
        local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar9._0_16_,auVar12._0_16_);
        cVar7 = cbtVector3::length2(&local_40);
        in_ZMM1 = ZEXT464((uint)this->m_weldingThreshold);
        if (cVar7 <= this->m_weldingThreshold) goto LAB_00dfa04f;
        uVar6 = (ulong)((int)uVar6 + 1);
      }
    }
    this_00 = &this->m_3componentVertices;
    cbtAlignedObjectArray<float>::push_back(this_00,vertex->m_floats);
    cbtAlignedObjectArray<float>::push_back(this_00,vertex->m_floats + 1);
    cbtAlignedObjectArray<float>::push_back(this_00,vertex->m_floats + 2);
    pcVar3 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
    piVar1 = &pcVar3->m_numVertices;
    *piVar1 = *piVar1 + 1;
    pcVar3->m_vertexBase = (uchar *)(this->m_3componentVertices).m_data;
    iVar4 = (this->m_3componentVertices).m_size / 3;
  }
  uVar6 = (ulong)(iVar4 - 1);
LAB_00dfa04f:
  return (int)uVar6;
}

Assistant:

int cbtTriangleMesh::findOrAddVertex(const cbtVector3& vertex, bool removeDuplicateVertices)
{
	//return index of new/existing vertex
	///@todo: could use acceleration structure for this
	if (m_use4componentVertices)
	{
		if (removeDuplicateVertices)
		{
			for (int i = 0; i < m_4componentVertices.size(); i++)
			{
				if ((m_4componentVertices[i] - vertex).length2() <= m_weldingThreshold)
				{
					return i;
				}
			}
		}
		m_indexedMeshes[0].m_numVertices++;
		m_4componentVertices.push_back(vertex);
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_4componentVertices[0];

		return m_4componentVertices.size() - 1;
	}
	else
	{
		if (removeDuplicateVertices)
		{
			for (int i = 0; i < m_3componentVertices.size(); i += 3)
			{
				cbtVector3 vtx(m_3componentVertices[i], m_3componentVertices[i + 1], m_3componentVertices[i + 2]);
				if ((vtx - vertex).length2() <= m_weldingThreshold)
				{
					return i / 3;
				}
			}
		}
		m_3componentVertices.push_back(vertex.getX());
		m_3componentVertices.push_back(vertex.getY());
		m_3componentVertices.push_back(vertex.getZ());
		m_indexedMeshes[0].m_numVertices++;
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_3componentVertices[0];
		return (m_3componentVertices.size() / 3) - 1;
	}
}